

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader.h
# Opt level: O1

int SafeDecodeSymbol(HuffmanCode *table,BrotliBitReader *br,uint32_t *result)

{
  HuffmanCode *pHVar1;
  byte bVar2;
  uint32_t uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar3 = br->bit_pos_;
  if (uVar3 == 0x40) {
    if (table->bits != '\0') {
      return 0;
    }
  }
  else {
    uVar4 = br->val_ >> ((byte)uVar3 & 0x3f);
    table = table + (uVar4 & 0xff);
    bVar2 = table->bits;
    if (bVar2 < 9) {
      if (0x40 - uVar3 < (uint)bVar2) {
        return 0;
      }
      uVar3 = uVar3 + bVar2;
    }
    else {
      if (0x40 - uVar3 < 9) {
        return 0;
      }
      uVar5 = (uint)table->value + (((uint)uVar4 & kBitMask[(uint)bVar2]) >> 8);
      pHVar1 = table + uVar5;
      if (0x38 - uVar3 < (uint)pHVar1->bits) {
        return 0;
      }
      table = table + uVar5;
      uVar3 = uVar3 + pHVar1->bits + 8;
    }
    br->bit_pos_ = uVar3;
  }
  *result = (uint)table->value;
  return 1;
}

Assistant:

static BROTLI_INLINE uint32_t BrotliGetAvailableBits(
    const BrotliBitReader* br) {
  return (BROTLI_64_BITS ? 64 : 32) - br->bit_pos_;
}